

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturehelper.cpp
# Opt level: O2

void __thiscall
QOpenGLTextureHelper::qt_CompressedTextureSubImage2D
          (QOpenGLTextureHelper *this,GLuint texture,GLenum target,GLenum bindingTarget,GLint level,
          GLint xoffset,GLint yoffset,GLsizei width,GLsizei height,GLenum format,GLsizei imageSize,
          GLvoid *bits)

{
  long in_FS_OFFSET;
  undefined1 local_48 [12];
  GLint GStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_1b4087::TextureBinder::TextureBinder
            ((TextureBinder *)local_48,this->functions,texture,target,bindingTarget);
  (*this->CompressedTexSubImage2D)(target,level,xoffset,yoffset,width,height,format,imageSize,bits);
  (*(code *)**(undefined8 **)local_48._0_8_)((ulong)stack0xffffffffffffffc0 & 0xffffffff,GStack_3c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureHelper::qt_CompressedTextureSubImage2D(GLuint texture, GLenum target, GLenum bindingTarget, GLint level, GLint xoffset, GLint yoffset, GLsizei width, GLsizei height, GLenum format, GLsizei imageSize, const GLvoid *bits)
{
    TextureBinder binder(functions, texture, target, bindingTarget);
    glCompressedTexSubImage2D(target, level, xoffset, yoffset, width, height, format, imageSize, bits);
}